

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.hpp
# Opt level: O2

SubcaseBasePtr
deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::ImageLoadStoreDataAlignmentTest>(void)

{
  Functions *pFVar1;
  Context *pCVar2;
  SubcaseBase *ptr;
  Functions *pFVar3;
  glActiveShaderProgramFunc p_Var4;
  ulong uVar5;
  SharedPtrStateBase *extraout_RDX;
  SharedPtr<deqp::SubcaseBase> *in_RDI;
  Functions *pFVar6;
  SubcaseBasePtr SVar7;
  
  ptr = (SubcaseBase *)operator_new(0x90);
  gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::ShaderImageLoadStoreBase
            ((ShaderImageLoadStoreBase *)ptr);
  (ptr->super_GLWrapper)._vptr_GLWrapper =
       (_func_int **)&PTR__ImageLoadStoreDataAlignmentTest_01dcc0e0;
  ptr[1].super_GLWrapper.super_CallLogWrapper.m_log = (TestLog *)0x0;
  *(undefined8 *)&ptr[1].super_GLWrapper.super_CallLogWrapper.m_enableLog = 0;
  ptr[1].super_GLWrapper._vptr_GLWrapper = (_func_int **)0x0;
  ptr[1].super_GLWrapper.super_CallLogWrapper.m_gl = (Functions *)0x0;
  ptr[1].super_GLWrapper.m_context = (Context *)0x0;
  ptr[2].super_GLWrapper._vptr_GLWrapper = (_func_int **)0x0;
  ptr[2].super_GLWrapper.super_CallLogWrapper.m_gl = (Functions *)0x0;
  ptr[2].super_GLWrapper.super_CallLogWrapper.m_log = (TestLog *)0x0;
  *(undefined8 *)&ptr[2].super_GLWrapper.super_CallLogWrapper.m_enableLog = 0;
  ptr[2].super_GLWrapper.m_context = (Context *)0x0;
  ptr[3].super_GLWrapper._vptr_GLWrapper = (_func_int **)0x0;
  ptr[1].super_GLWrapper.super_CallLogWrapper.m_log = (TestLog *)0x8;
  pFVar3 = (Functions *)operator_new(0x40);
  ptr[1].super_GLWrapper.super_CallLogWrapper.m_gl = pFVar3;
  uVar5 = (long)ptr[1].super_GLWrapper.super_CallLogWrapper.m_log * 4 - 4U & 0xfffffffffffffff8;
  pFVar1 = (Functions *)((long)&pFVar3->activeShaderProgram + uVar5);
  for (pFVar6 = pFVar1; pFVar6 < (Functions *)((long)&pFVar3->activeTexture + uVar5);
      pFVar6 = (Functions *)&pFVar6->activeTexture) {
    p_Var4 = (glActiveShaderProgramFunc)operator_new(0x200);
    pFVar6->activeShaderProgram = p_Var4;
  }
  ptr[2].super_GLWrapper.super_CallLogWrapper.m_gl = pFVar1;
  pCVar2 = (Context *)pFVar1->activeShaderProgram;
  ptr[1].super_GLWrapper.m_context = pCVar2;
  ptr[2].super_GLWrapper._vptr_GLWrapper = (_func_int **)(pCVar2 + 0x10);
  ptr[3].super_GLWrapper._vptr_GLWrapper = (_func_int **)pFVar1;
  *(Context **)&ptr[2].super_GLWrapper.super_CallLogWrapper.m_enableLog = pCVar2;
  ptr[2].super_GLWrapper.m_context = pCVar2 + 0x10;
  *(Context **)&ptr[1].super_GLWrapper.super_CallLogWrapper.m_enableLog = pCVar2;
  ptr[2].super_GLWrapper.super_CallLogWrapper.m_log = (TestLog *)pCVar2;
  ptr[3].super_GLWrapper.super_CallLogWrapper.m_gl = (Functions *)0x0;
  *(undefined4 *)&ptr[3].super_GLWrapper.super_CallLogWrapper.m_log = 0;
  de::SharedPtr<deqp::SubcaseBase>::SharedPtr(in_RDI,ptr);
  SVar7.m_state = extraout_RDX;
  SVar7.m_ptr = (SubcaseBase *)in_RDI;
  return SVar7;
}

Assistant:

static SubcaseBase::SubcaseBasePtr Create()
	{
		return SubcaseBase::SubcaseBasePtr(new Type());
	}